

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_morton.h
# Opt level: O1

void __thiscall
embree::sse2::BVHBuilderMorton::
BuilderT<embree::BVHNodeRecord<embree::NodeRefPtr<4>_>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNode_t<embree::NodeRefPtr<4>,_4>::Create,_embree::sse2::SetBVHNBounds<4>,_embree::sse2::CreateMortonLeaf<4,_embree::TriangleMi<4>_>,_embree::sse2::CalculateMeshBounds<embree::TriangleMesh>,_embree::Scene::BuildProgressMonitorInterface>
::recreateMortonCodes
          (BuilderT<embree::BVHNodeRecord<embree::NodeRefPtr<4>_>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNode_t<embree::NodeRefPtr<4>,_4>::Create,_embree::sse2::SetBVHNBounds<4>,_embree::sse2::CreateMortonLeaf<4,_embree::TriangleMi<4>_>,_embree::sse2::CalculateMeshBounds<embree::TriangleMesh>,_embree::Scene::BuildProgressMonitorInterface>
           *this,range<unsigned_int> *current)

{
  BuildPrim *pBVar1;
  BuildPrim *pBVar2;
  TriangleMesh *pTVar3;
  long lVar4;
  char *pcVar5;
  size_t sVar6;
  char cVar7;
  runtime_error *prVar8;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  size_t i;
  ulong uVar12;
  undefined1 auVar13 [16];
  float fVar14;
  undefined8 extraout_XMM1_Qa;
  float fVar15;
  float fVar16;
  undefined8 extraout_XMM1_Qb;
  float fVar17;
  uint uVar18;
  uint uVar20;
  uint uVar21;
  undefined1 auVar19 [16];
  float fVar22;
  float fVar23;
  undefined1 in_XMM4 [16];
  vfloat4 lower;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  anon_class_8_1_8991fb9c calculateCentBounds;
  MortonCodeMapping mapping;
  task_group_context context;
  auto_partitioner local_169;
  range<unsigned_int> local_168;
  undefined8 uStack_160;
  anon_class_8_1_8991fb9c local_150;
  undefined8 local_148;
  lambda_reduce_body<tbb::detail::d1::blocked_range<unsigned_int>,_embree::BBox<embree::Vec3fa>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh____builders_______common_algorithms_parallel_reduce_h:59:7),_const_embree::BBox<embree::Vec3fa>_(const_embree::BBox<embree::Vec3fa>_&,_const_embree::BBox<embree::Vec3fa>_&)>
  *local_140;
  undefined8 local_138;
  undefined8 uStack_130;
  anon_class_16_2_ed117de8_conflict24 local_128;
  lambda_reduce_body<tbb::detail::d1::blocked_range<unsigned_int>,_embree::BBox<embree::Vec3fa>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh____builders_______common_algorithms_parallel_reduce_h:59:7),_const_embree::BBox<embree::Vec3fa>_(const_embree::BBox<embree::Vec3fa>_&,_const_embree::BBox<embree::Vec3fa>_&)>
  local_118;
  task_group_context local_d8;
  undefined1 local_58 [8];
  anon_class_16_2_ed117de8_conflict24 *paStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  uVar18 = current->_begin;
  uVar12 = (ulong)uVar18;
  uVar20 = current->_end;
  if (uVar20 - uVar18 < 0x400) {
    auVar13 = _DAT_01feb9f0;
    auVar19 = _DAT_01feba00;
    if (uVar18 < uVar20) {
      pTVar3 = this->calculateBounds->mesh;
      lVar4 = *(long *)&(pTVar3->super_Geometry).field_0x58;
      pcVar5 = (pTVar3->vertices0).super_RawBufferView.ptr_ofs;
      sVar6 = (pTVar3->vertices0).super_RawBufferView.stride;
      uVar9 = uVar12;
      do {
        lVar11 = (ulong)this->morton[uVar9].field_0.field_0.index * *(long *)&pTVar3->field_0x68;
        in_XMM4 = *(undefined1 (*) [16])(pcVar5 + *(uint *)(lVar4 + 8 + lVar11) * sVar6);
        auVar24 = minps(*(undefined1 (*) [16])(pcVar5 + *(uint *)(lVar4 + lVar11) * sVar6),
                        *(undefined1 (*) [16])(pcVar5 + *(uint *)(lVar4 + 4 + lVar11) * sVar6));
        auVar25 = minps(auVar24,in_XMM4);
        auVar24 = maxps(*(undefined1 (*) [16])(pcVar5 + *(uint *)(lVar4 + lVar11) * sVar6),
                        *(undefined1 (*) [16])(pcVar5 + *(uint *)(lVar4 + 4 + lVar11) * sVar6));
        auVar24 = maxps(auVar24,in_XMM4);
        auVar26._0_4_ = auVar24._0_4_ + auVar25._0_4_;
        auVar26._4_4_ = auVar24._4_4_ + auVar25._4_4_;
        auVar26._8_4_ = auVar24._8_4_ + auVar25._8_4_;
        auVar26._12_4_ = auVar24._12_4_ + auVar25._12_4_;
        auVar13 = minps(auVar13,auVar26);
        auVar19 = maxps(auVar19,auVar26);
        uVar9 = uVar9 + 1;
      } while (uVar20 != uVar9);
    }
    uVar9 = (ulong)current->_end;
    if (uVar18 < current->_end) {
      auVar24._0_4_ = auVar19._0_4_ - auVar13._0_4_;
      auVar24._4_4_ = auVar19._4_4_ - auVar13._4_4_;
      auVar24._8_4_ = auVar19._8_4_ - auVar13._8_4_;
      auVar24._12_4_ = auVar19._12_4_ - auVar13._12_4_;
      auVar19 = rcpps(in_XMM4,auVar24);
      fVar14 = auVar19._0_4_;
      fVar15 = auVar19._4_4_;
      fVar16 = auVar19._8_4_;
      do {
        pTVar3 = this->calculateBounds->mesh;
        lVar11 = (ulong)this->morton[uVar12].field_0.field_0.index * *(long *)&pTVar3->field_0x68;
        lVar4 = *(long *)&(pTVar3->super_Geometry).field_0x58;
        pcVar5 = (pTVar3->vertices0).super_RawBufferView.ptr_ofs;
        sVar6 = (pTVar3->vertices0).super_RawBufferView.stride;
        auVar19 = minps(*(undefined1 (*) [16])(pcVar5 + *(uint *)(lVar4 + lVar11) * sVar6),
                        *(undefined1 (*) [16])(pcVar5 + *(uint *)(lVar4 + 4 + lVar11) * sVar6));
        auVar26 = minps(auVar19,*(undefined1 (*) [16])
                                 (pcVar5 + *(uint *)(lVar4 + 8 + lVar11) * sVar6));
        auVar19 = maxps(*(undefined1 (*) [16])(pcVar5 + *(uint *)(lVar4 + lVar11) * sVar6),
                        *(undefined1 (*) [16])(pcVar5 + *(uint *)(lVar4 + 4 + lVar11) * sVar6));
        auVar19 = maxps(auVar19,*(undefined1 (*) [16])
                                 (pcVar5 + *(uint *)(lVar4 + 8 + lVar11) * sVar6));
        uVar18 = (uint)(((auVar19._0_4_ + auVar26._0_4_) - auVar13._0_4_) *
                       (float)((uint)(((1.0 - auVar24._0_4_ * fVar14) * fVar14 + fVar14) * 1013.76)
                              & -(uint)(1e-19 < auVar24._0_4_)));
        uVar20 = (uint)(((auVar19._4_4_ + auVar26._4_4_) - auVar13._4_4_) *
                       (float)((uint)(((1.0 - auVar24._4_4_ * fVar15) * fVar15 + fVar15) * 1013.76)
                              & -(uint)(1e-19 < auVar24._4_4_)));
        uVar21 = (uint)(((auVar19._8_4_ + auVar26._8_4_) - auVar13._8_4_) *
                       (float)((uint)(((1.0 - auVar24._8_4_ * fVar16) * fVar16 + fVar16) * 1013.76)
                              & -(uint)(1e-19 < auVar24._8_4_)));
        uVar18 = (uVar18 << 0x10 | uVar18) & 0x30000ff;
        uVar18 = (uVar18 << 8 | uVar18) & 0x300f00f;
        uVar20 = (uVar20 << 0x10 | uVar20) & 0x30000ff;
        uVar10 = (uVar20 << 8 | uVar20) & 0x300f00f;
        uVar20 = (uVar21 << 0x10 | uVar21) & 0x30000ff;
        uVar20 = (uVar20 << 8 | uVar20) & 0x300f00f;
        this->morton[uVar12].field_0.field_0.code =
             ((uVar20 << 4 | uVar20) & 0x30c30c3) * 0x14 & 0x24924924 |
             ((uVar10 << 4 | uVar10) & 0x30c30c3) * 10 & 0x12492492 |
             ((uVar18 << 4 | uVar18) & 0x30c30c3) * 5 & 0x9249249;
        uVar12 = uVar12 + 1;
        uVar9 = (ulong)current->_end;
      } while (uVar12 < uVar9);
    }
    uVar18 = current->_begin;
    if (uVar18 != (uint)uVar9) {
      pBVar1 = this->morton + uVar9;
      pBVar2 = this->morton + uVar18;
      uVar12 = (long)(uVar9 * 8 + (ulong)uVar18 * -8) >> 3;
      lVar4 = 0x3f;
      if (uVar12 != 0) {
        for (; uVar12 >> lVar4 == 0; lVar4 = lVar4 + -1) {
        }
      }
      std::
      __introsort_loop<embree::sse2::BVHBuilderMorton::BuildPrim*,long,__gnu_cxx::__ops::_Iter_less_iter>
                (pBVar2,pBVar1,((uint)lVar4 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<embree::sse2::BVHBuilderMorton::BuildPrim*,__gnu_cxx::__ops::_Iter_less_iter>
                (pBVar2,pBVar1);
      return;
    }
  }
  else {
    local_58 = (undefined1  [8])0x7f8000007f800000;
    paStack_50 = (anon_class_16_2_ed117de8_conflict24 *)0x7f8000007f800000;
    local_48 = 0xff800000ff800000;
    uStack_40 = 0xff800000ff800000;
    local_d8.my_version = proxy_support;
    local_d8.my_traits = (context_traits)0x4;
    local_d8.my_node.my_prev_node = (intrusive_list_node *)0x0;
    local_d8.my_node.my_next_node = (intrusive_list_node *)0x0;
    local_d8.my_name = CUSTOM_CTX;
    local_150.this =
         (BuilderT<embree::BVHNodeRecord<embree::NodeRefPtr<4>_>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNode_t<embree::NodeRefPtr<4>,_4>::Create,_embree::sse2::SetBVHNBounds<4>,_embree::sse2::CreateMortonLeaf<4,_embree::TriangleM<4>_>,_embree::sse2::CalculateMeshBounds<embree::TriangleMesh>,_embree::Scene::BuildProgressMonitorInterface>
          *)this;
    tbb::detail::r1::initialize(&local_d8);
    local_148._4_4_ = uVar18;
    local_148._0_4_ = uVar20;
    local_140 = (lambda_reduce_body<tbb::detail::d1::blocked_range<unsigned_int>,_embree::BBox<embree::Vec3fa>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh____builders_______common_algorithms_parallel_reduce_h:59:7),_const_embree::BBox<embree::Vec3fa>_(const_embree::BBox<embree::Vec3fa>_&,_const_embree::BBox<embree::Vec3fa>_&)>
                 *)0x400;
    local_118.my_real_body = &local_128;
    local_128.reduction = BBox<embree::Vec3fa>::merge;
    local_128.func = &local_150;
    local_118.my_reduction = BBox<embree::Vec3fa>::merge;
    local_118.my_value.lower.field_0._0_8_ = local_58;
    local_118.my_value.lower.field_0._8_8_ = paStack_50;
    local_118.my_value.upper.field_0._0_8_ = local_48;
    local_118.my_value.upper.field_0._8_8_ = uStack_40;
    local_118.my_identity_element = (BBox<embree::Vec3fa> *)local_58;
    tbb::detail::d1::
    start_reduce<tbb::detail::d1::blocked_range<unsigned_int>,_tbb::detail::d1::lambda_reduce_body<tbb::detail::d1::blocked_range<unsigned_int>,_embree::BBox<embree::Vec3fa>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/kernels/bvh/../builders/../../common/algorithms/parallel_reduce.h:59:7),_const_embree::BBox<embree::Vec3fa>_(const_embree::BBox<embree::Vec3fa>_&,_const_embree::BBox<embree::Vec3fa>_&)>,_const_tbb::detail::d1::auto_partitioner>
    ::run((blocked_range<unsigned_int> *)&local_148,&local_118,&local_169,&local_d8);
    local_138 = (BBox<embree::Vec3fa> *)local_118.my_value.lower.field_0._0_8_;
    uStack_130 = (anon_class_16_2_ed117de8_conflict24 *)local_118.my_value.lower.field_0._8_8_;
    local_168._begin = (uint)local_118.my_value.upper.field_0.m128[0];
    local_168._end = (uint)local_118.my_value.upper.field_0.m128[1];
    uStack_160 = local_118.my_value.upper.field_0._8_8_;
    cVar7 = tbb::detail::r1::is_group_execution_cancelled(&local_d8);
    if (cVar7 != '\0') {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar8,"task cancelled");
      __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    tbb::detail::r1::destroy(&local_d8);
    auVar19._8_8_ = extraout_XMM1_Qb;
    auVar19._0_8_ = extraout_XMM1_Qa;
    local_118.my_identity_element = local_138;
    local_118.my_real_body = uStack_130;
    fVar22 = (float)local_168._begin - (float)local_138;
    fVar23 = (float)local_168._end - local_138._4_4_;
    uStack_160._0_4_ = (float)uStack_160 - (float)uStack_130;
    uStack_160._4_4_ = uStack_160._4_4_ - uStack_130._4_4_;
    auVar13._4_4_ = fVar23;
    auVar13._0_4_ = fVar22;
    auVar13._8_4_ = (float)uStack_160;
    auVar13._12_4_ = uStack_160._4_4_;
    auVar13 = rcpps(auVar19,auVar13);
    fVar14 = auVar13._0_4_;
    fVar15 = auVar13._4_4_;
    fVar16 = auVar13._8_4_;
    fVar17 = auVar13._12_4_;
    local_118._24_4_ =
         (uint)(((1.0 - (float)uStack_160 * fVar16) * fVar16 + fVar16) * 1013.76) &
         -(uint)(1e-19 < (float)uStack_160);
    local_118._28_4_ =
         (uint)(((1.0 - uStack_160._4_4_ * fVar17) * fVar17 + fVar17) * 1013.76) &
         -(uint)(1e-19 < uStack_160._4_4_);
    local_118.my_reduction =
         (_func_BBox<embree::Vec3fa>_BBox<embree::Vec3fa>_ptr_BBox<embree::Vec3fa>_ptr *)
         CONCAT44((uint)(((1.0 - fVar23 * fVar15) * fVar15 + fVar15) * 1013.76) &
                  -(uint)(1e-19 < fVar23),
                  (uint)(((1.0 - fVar22 * fVar14) * fVar14 + fVar14) * 1013.76) &
                  -(uint)(1e-19 < fVar22));
    local_d8.my_version = proxy_support;
    local_d8.my_traits = (context_traits)0x4;
    local_d8.my_node.my_prev_node = (intrusive_list_node *)0x0;
    local_d8.my_node.my_next_node = (intrusive_list_node *)0x0;
    local_d8.my_name = CUSTOM_CTX;
    local_168 = *current;
    uStack_160 = 0;
    local_148 = this;
    local_140 = &local_118;
    tbb::detail::r1::initialize(&local_d8);
    local_58._4_4_ = local_168._begin;
    local_58._0_4_ = local_168._end;
    paStack_50 = (anon_class_16_2_ed117de8_conflict24 *)0x400;
    local_128.reduction =
         (_func_BBox<embree::Vec3fa>_BBox<embree::Vec3fa>_ptr_BBox<embree::Vec3fa>_ptr *)&local_148;
    tbb::detail::d1::
    start_for<tbb::detail::d1::blocked_range<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/kernels/bvh/../../common/algorithms/parallel_for.h:70:73),_const_tbb::detail::d1::auto_partitioner>
    ::run((blocked_range<unsigned_int> *)local_58,(anon_class_8_1_898bcfc2 *)&local_128,&local_169,
          &local_d8);
    cVar7 = tbb::detail::r1::is_group_execution_cancelled(&local_d8);
    if (cVar7 != '\0') {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar8,"task cancelled");
      __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    tbb::detail::r1::destroy(&local_d8);
    tbb::detail::d1::
    parallel_sort<embree::sse2::BVHBuilderMorton::BuildPrim*,std::less<embree::sse2::BVHBuilderMorton::BuildPrim>>
              (this->morton + current->_begin,this->morton + current->_end,
               (less<embree::sse2::BVHBuilderMorton::BuildPrim> *)&local_d8);
  }
  return;
}

Assistant:

__noinline void recreateMortonCodes(const range<unsigned>& current) const
        {
          /* fast path for small ranges */
          if (likely(current.size() < 1024))
          {
            /*! recalculate centroid bounds */
            BBox3fa centBounds(empty);
            for (size_t i=current.begin(); i<current.end(); i++)
              centBounds.extend(center2(calculateBounds(morton[i])));

            /* recalculate morton codes */
            MortonCodeMapping mapping(centBounds);
            for (size_t i=current.begin(); i<current.end(); i++)
              morton[i].code = mapping.code(calculateBounds(morton[i]));

            /* sort morton codes */
            std::sort(morton+current.begin(),morton+current.end());
          }
          else
          {
            /*! recalculate centroid bounds */
            auto calculateCentBounds = [&] ( const range<unsigned>& r ) {
              BBox3fa centBounds = empty;
              for (size_t i=r.begin(); i<r.end(); i++)
                centBounds.extend(center2(calculateBounds(morton[i])));
              return centBounds;
            };
            const BBox3fa centBounds = parallel_reduce(current.begin(), current.end(), unsigned(1024),
                                                       BBox3fa(empty), calculateCentBounds, BBox3fa::merge);

            /* recalculate morton codes */
            MortonCodeMapping mapping(centBounds);
            parallel_for(current.begin(), current.end(), unsigned(1024), [&] ( const range<unsigned>& r ) {
                for (size_t i=r.begin(); i<r.end(); i++) {
                  morton[i].code = mapping.code(calculateBounds(morton[i]));
                }
              });

            /*! sort morton codes */
#if defined(TASKING_TBB)
            tbb::parallel_sort(morton+current.begin(),morton+current.end());
#else
            radixsort32(morton+current.begin(),current.size());
#endif
          }
        }